

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void glcts::TextureCubeMapArraySamplingTest::getAttributes
               (samplerType sampler_type,attributeDefinition **out_attribute_definitions,
               GLuint *out_n_attributes)

{
  attributeDefinition *paVar1;
  
  paVar1 = (attributeDefinition *)0x0;
  if (sampler_type == Depth) {
    paVar1 = getAttributes::depth_attributes;
  }
  *out_attribute_definitions = paVar1;
  *out_n_attributes = (uint)(sampler_type == Depth);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getAttributes(samplerType					sampler_type,
													const attributeDefinition*& out_attribute_definitions,
													glw::GLuint&				out_n_attributes)
{
	static attributeDefinition depth_attributes[] = { { attribute_refZ, type_float, RefZ, 1 } };

	static const glw::GLuint n_depth_attributes = sizeof(depth_attributes) / sizeof(depth_attributes[0]);

	switch (sampler_type)
	{
	case Depth:
		out_attribute_definitions = depth_attributes;
		out_n_attributes		  = n_depth_attributes;
		break;
	default:
		out_attribute_definitions = 0;
		out_n_attributes		  = 0;
		break;
	};
}